

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O2

uint8_t parse_memtm_mapping_entry_10(uint16_t pos,uint16_t len,uint16_t hdr_pos)

{
  ulong uVar1;
  uint8_t uVar2;
  char *pcVar3;
  
  if (len < 4) {
    printf("Unknown timing mapping entry length: %u\n",(ulong)len);
    uVar2 = 0xff;
  }
  else {
    uVar1 = (ulong)pos;
    if (bios->data[uVar1 + 1] == 0xff) {
      puts(" Timing entry: none/boot");
    }
    else {
      printf(" Timing entry: %u\n");
    }
    if (((bios->power).bit)->version == '\x02') {
      printf(" DLL         : ");
      pcVar3 = "disabled";
      if ((bios->data[uVar1 + 2] & 0x40) == 0) {
        pcVar3 = "enabled";
      }
      puts(pcVar3);
      printf(" FBVDDQ      : ");
      pcVar3 = "directbewriteaddresslow";
      if ((bios->data[uVar1 + 4] & 8) == 0) {
        pcVar3 = "directbewriteaddresshigh";
      }
      puts(pcVar3 + 0x14);
    }
    putchar(10);
    uVar2 = bios->data[uVar1 + 1];
  }
  return uVar2;
}

Assistant:

uint8_t parse_memtm_mapping_entry_10(uint16_t pos, uint16_t len, uint16_t hdr_pos)
{
	if (len < 4) {
		printf("Unknown timing mapping entry length: %u\n", len);
		return 0xff;
	}

	if (bios->data[pos+1] != 0xff) {
		printf(" Timing entry: %u\n", bios->data[pos+1]);
	} else {
		printf(" Timing entry: none/boot\n");
	}

	if (bios->power.bit->version == 2) {
		printf(" DLL         : ");
		if(bios->data[pos+2] & 0x40)
			printf("disabled\n");
		else
			printf("enabled\n");

		printf(" FBVDDQ      : ");
		if(bios->data[pos+4] & 0x8)
			printf("low\n");
		else
			printf("high\n");
	}

	printf("\n");

	return bios->data[pos+1];
}